

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_ListFieldsOneOf_Test::
~GeneratedMessageReflectionTest_ListFieldsOneOf_Test
          (GeneratedMessageReflectionTest_ListFieldsOneOf_Test *this)

{
  GeneratedMessageReflectionTest_ListFieldsOneOf_Test *this_local;
  
  ~GeneratedMessageReflectionTest_ListFieldsOneOf_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, ListFieldsOneOf) {
  unittest::TestOneof2 message;
  TestUtil::SetOneof1(&message);

  const Reflection* reflection = message.GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);
  EXPECT_EQ(4, fields.size());
}